

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::convertInitializerList
          (TParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer)

{
  EShSource EVar1;
  TVector<glslang::TArraySize> *pTVar2;
  TType *type_00;
  TIntermediate *pTVar3;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TArraySizes *pTVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  TBasicType to;
  TBasicType from;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar10;
  long *plVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  pool_allocator<char> pVar12;
  long lVar13;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TIntermTyped *pTVar14;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar15;
  ulong uVar16;
  _func_int **pp_Var17;
  int d;
  TParseContext *pTVar18;
  undefined8 in_stack_fffffffffffffd50;
  TType arrayType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_208 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1e0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_1b8 [40];
  TType elementType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  TIntermNode *node;
  
  iVar7 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  node = (TIntermNode *)CONCAT44(extraout_var,iVar7);
  if (node == (TIntermNode *)0x0) {
    return initializer;
  }
  if (node[5].loc.column != 0) {
    return initializer;
  }
  iVar7 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar7 == '\0') {
    iVar7 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar7 == '\0') {
      iVar7 = (*type->_vptr_TType[0x1c])(type);
      if ((char)iVar7 == '\0') {
        iVar7 = (*type->_vptr_TType[0x1b])(type);
        if ((char)iVar7 == '\0') {
          pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar1 = pTVar3->source;
          bVar6 = pTVar3->enhancedMsgs;
          pTVar18 = this;
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_208,"",(pool_allocator<char> *)&elementType);
          pVar12.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_f8,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
          name_00._M_dataplus._M_p = (pointer)local_f8;
          name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_208;
          name_00._M_string_length = (size_type)pTVar18;
          name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffd50;
          name_00.field_2._8_8_ = pVar12.allocator;
          structName_00._M_dataplus._M_p = (pointer)arrayType._8_8_;
          structName_00._M_dataplus.super_allocator_type.allocator =
               (TPoolAllocator *)arrayType._vptr_TType;
          structName_00._16_24_ = arrayType.qualifier._0_24_;
          TType::getCompleteString
                    ((TString *)&arrayType,type,(bool)(EVar1 == EShSourceGlsl & bVar6),true,true,
                     true,name_00,structName_00);
          pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar15 = "unexpected initializer-list type:";
        }
        else {
          iVar7 = (*type->_vptr_TType[0xc])(type);
          iVar8 = (*node->_vptr_TIntermNode[0x32])(node);
          if (iVar7 == (int)((ulong)(*(long *)(CONCAT44(extraout_var_11,iVar8) + 0x10) -
                                    *(long *)(CONCAT44(extraout_var_11,iVar8) + 8)) >> 3)) {
            to = (*type->_vptr_TType[7])(type);
            iVar7 = (*type->_vptr_TType[0xc])(type);
            if (0 < iVar7) {
              lVar13 = 0;
              do {
                iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
                plVar10 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_12,iVar7)
                                                                    + 8) + lVar13 * 8) + 0x18))();
                from = (**(code **)(*plVar10 + 0x100))(plVar10);
                if ((to != from) &&
                   (bVar6 = TIntermediate::canImplicitlyPromote
                                      ((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate,from,to,EOpNull), !bVar6)) {
                  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  EVar1 = pTVar3->source;
                  bVar6 = pTVar3->enhancedMsgs;
                  pTVar18 = this;
                  elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  basic_string<glslang::std::allocator<char>>
                            (local_a8,"",(pool_allocator<char> *)&elementType);
                  pVar12.allocator = GetThreadPoolAllocator();
                  std::__cxx11::
                  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                  basic_string<glslang::std::allocator<char>>
                            (local_d0,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
                  name_02._M_dataplus._M_p = (pointer)local_d0;
                  name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_a8;
                  name_02._M_string_length = (size_type)pTVar18;
                  name_02.field_2._M_allocated_capacity = (size_type)loc;
                  name_02.field_2._8_8_ = pVar12.allocator;
                  structName_02._M_dataplus._M_p = (pointer)arrayType._8_8_;
                  structName_02._M_dataplus.super_allocator_type.allocator =
                       (TPoolAllocator *)arrayType._vptr_TType;
                  structName_02._16_24_ = arrayType.qualifier._0_24_;
                  TType::getCompleteString
                            ((TString *)&arrayType,type,(bool)(EVar1 == EShSourceGlsl & bVar6),true,
                             true,true,name_02,structName_02);
                  pp_Var17 = (this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions;
                  pcVar15 = "type mismatch in initializer list";
                  goto LAB_004bff1c;
                }
                lVar13 = lVar13 + 1;
                iVar7 = (*type->_vptr_TType[0xc])(type);
              } while (lVar13 < iVar7);
            }
            goto LAB_004bfcc0;
          }
          pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar1 = pTVar3->source;
          bVar6 = pTVar3->enhancedMsgs;
          pTVar18 = this;
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_1e0,"",(pool_allocator<char> *)&elementType);
          pVar12.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_80,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
          name_01._M_dataplus._M_p = (pointer)local_80;
          name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_1e0;
          name_01._M_string_length = (size_type)pTVar18;
          name_01.field_2._M_allocated_capacity = in_stack_fffffffffffffd50;
          name_01.field_2._8_8_ = pVar12.allocator;
          structName_01._M_dataplus._M_p = (pointer)arrayType._8_8_;
          structName_01._M_dataplus.super_allocator_type.allocator =
               (TPoolAllocator *)arrayType._vptr_TType;
          structName_01._16_24_ = arrayType.qualifier._0_24_;
          TType::getCompleteString
                    ((TString *)&arrayType,type,(bool)(EVar1 == EShSourceGlsl & bVar6),true,true,
                     true,name_01,structName_01);
          pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar15 = "wrong vector size (or rows in a matrix column):";
        }
      }
      else {
        iVar7 = (*type->_vptr_TType[0xd])();
        iVar8 = (*node->_vptr_TIntermNode[0x32])(node);
        if (iVar7 == (int)((ulong)(*(long *)(CONCAT44(extraout_var_07,iVar8) + 0x10) -
                                  *(long *)(CONCAT44(extraout_var_07,iVar8) + 8)) >> 3)) {
          TType::TType(&arrayType,type,0,false);
          iVar7 = (*type->_vptr_TType[0xd])(type);
          if (0 < iVar7) {
            lVar13 = 0;
            do {
              iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
              pTVar14 = (TIntermTyped *)
                        (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_08,iVar7) + 8) +
                                                lVar13 * 8) + 0x18))();
              pTVar14 = convertInitializerList(this,loc,&arrayType,pTVar14);
              iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
              *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_09,iVar7) + 8) + lVar13 * 8) =
                   pTVar14;
              iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
              if (*(long *)(*(long *)(CONCAT44(extraout_var_10,iVar7) + 8) + lVar13 * 8) == 0) {
                return (TIntermTyped *)0x0;
              }
              lVar13 = lVar13 + 1;
              iVar7 = (*type->_vptr_TType[0xd])(type);
            } while (lVar13 < iVar7);
          }
LAB_004bfcc0:
          iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
          if (*(long *)(CONCAT44(extraout_var_13,iVar7) + 0x10) -
              *(long *)(CONCAT44(extraout_var_13,iVar7) + 8) == 8) {
            iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
            node = (TIntermNode *)**(undefined8 **)(CONCAT44(extraout_var_14,iVar7) + 8);
          }
          goto LAB_004c00a6;
        }
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        EVar1 = pTVar3->source;
        bVar6 = pTVar3->enhancedMsgs;
        pTVar18 = this;
        elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  (local_1b8,"",(pool_allocator<char> *)&elementType);
        pVar12.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  (local_58,"",(pool_allocator<char> *)&stack0xfffffffffffffd58);
        name._M_dataplus._M_p = (pointer)local_58;
        name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_1b8;
        name._M_string_length = (size_type)pTVar18;
        name.field_2._M_allocated_capacity = in_stack_fffffffffffffd50;
        name.field_2._8_8_ = pVar12.allocator;
        structName._M_dataplus._M_p = (pointer)arrayType._8_8_;
        structName._M_dataplus.super_allocator_type.allocator =
             (TPoolAllocator *)arrayType._vptr_TType;
        structName._16_24_ = arrayType.qualifier._0_24_;
        TType::getCompleteString
                  ((TString *)&arrayType,type,(bool)(EVar1 == EShSourceGlsl & bVar6),true,true,true,
                   name,structName);
        pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar15 = "wrong number of matrix columns:";
      }
    }
    else {
      iVar7 = (*type->_vptr_TType[0x25])();
      if ((char)iVar7 == '\0') {
LAB_004bfb11:
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      pcVar15 = (((type->field_13).referentType)->qualifier).semanticName;
      lVar13 = *(long *)&((type->field_13).referentType)->field_0x8;
      iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
      if ((long)pcVar15 - lVar13 >> 5 ==
          *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x10) -
          *(long *)(CONCAT44(extraout_var_03,iVar7) + 8) >> 3) {
        iVar7 = (*type->_vptr_TType[0x25])(type);
        if ((char)iVar7 != '\0') {
          lVar13 = 0;
          uVar16 = 0;
          do {
            if ((ulong)((long)(((type->field_13).referentType)->qualifier).semanticName -
                        *(long *)&((type->field_13).referentType)->field_0x8 >> 5) <= uVar16)
            goto LAB_004bfcc0;
            iVar7 = (*type->_vptr_TType[0x25])(type);
            if ((char)iVar7 == '\0') break;
            type_00 = *(TType **)
                       ((long)&((((type->field_13).structure)->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_start)->type + lVar13);
            iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
            pTVar14 = (TIntermTyped *)
                      (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_04,iVar7) + 8) +
                                              uVar16 * 8) + 0x18))();
            pTVar14 = convertInitializerList(this,loc,type_00,pTVar14);
            iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
            *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_05,iVar7) + 8) + uVar16 * 8) =
                 pTVar14;
            iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
            if (*(long *)(*(long *)(CONCAT44(extraout_var_06,iVar7) + 8) + uVar16 * 8) == 0) {
              return (TIntermTyped *)0x0;
            }
            uVar16 = uVar16 + 1;
            iVar7 = (*type->_vptr_TType[0x25])(type);
            lVar13 = lVar13 + 0x20;
          } while ((char)iVar7 != '\0');
        }
        goto LAB_004bfb11;
      }
      pp_Var17 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "wrong number of structure members";
      arrayType._8_8_ = "";
    }
LAB_004bff1c:
    pTVar14 = (TIntermTyped *)0x0;
    (*pp_Var17[0x2d])(this,loc,pcVar15,"initializer list",arrayType._8_8_);
  }
  else {
    TType::TType(&arrayType,EbtVoid,EvqTemporary,1,0,0,false);
    TType::shallowCopy(&arrayType,type);
    iVar7 = (*type->_vptr_TType[0x13])(type);
    TType::copyArraySizes(&arrayType,(TArraySizes *)CONCAT44(extraout_var_00,iVar7));
    iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
    pTVar4 = arrayType.arraySizes;
    TSmallArrayVector::changeFront
              (&(arrayType.arraySizes)->sizes,
               (uint)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x10) -
                             *(long *)(CONCAT44(extraout_var_01,iVar7) + 8)) >> 3));
    pTVar4->implicitlySized = false;
    iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
    plVar10 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_02,iVar7) + 8) +
                                  0x18))();
    if (((arrayType.arraySizes != (TArraySizes *)0x0) &&
        (pTVar2 = ((arrayType.arraySizes)->sizes).sizes,
        pTVar2 != (TVector<glslang::TArraySize> *)0x0)) &&
       (1 < (int)((ulong)((long)(pTVar2->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar2->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      plVar11 = (long *)(**(code **)(*plVar10 + 0xf0))(plVar10);
      cVar5 = (**(code **)(*plVar11 + 0xe8))(plVar11);
      if (cVar5 != '\0') {
        pTVar2 = ((arrayType.arraySizes)->sizes).sizes;
        if (pTVar2 == (TVector<glslang::TArraySize> *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = (int)((ulong)((long)(pTVar2->
                                      super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ).
                                      super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar2->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        plVar11 = (long *)(**(code **)(*plVar10 + 0xf0))(plVar10);
        lVar13 = (**(code **)(*plVar11 + 0x98))(plVar11);
        lVar13 = *(long *)(lVar13 + 8);
        if (lVar13 == 0) {
          iVar8 = 1;
        }
        else {
          iVar8 = (int)((ulong)(*(long *)(lVar13 + 0x10) - *(long *)(lVar13 + 8)) >> 4) + 1;
        }
        if (iVar7 == iVar8) {
          iVar7 = 1;
          while( true ) {
            pTVar2 = ((arrayType.arraySizes)->sizes).sizes;
            if (pTVar2 == (TVector<glslang::TArraySize> *)0x0) {
              iVar8 = 0;
            }
            else {
              iVar8 = (int)((ulong)((long)(pTVar2->
                                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ).
                                          super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar2->
                                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ).
                                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
            }
            if (iVar8 <= iVar7) break;
            uVar9 = TSmallArrayVector::getDimSize(&(arrayType.arraySizes)->sizes,iVar7);
            pTVar4 = arrayType.arraySizes;
            if (uVar9 == 0) {
              plVar11 = (long *)(**(code **)(*plVar10 + 0xf0))(plVar10);
              this_00 = (TSmallArrayVector *)(**(code **)(*plVar11 + 0x98))(plVar11);
              uVar9 = TSmallArrayVector::getDimSize(this_00,iVar7 + -1);
              TSmallArrayVector::setDimSize(&pTVar4->sizes,iVar7,uVar9);
            }
            iVar7 = iVar7 + 1;
          }
        }
      }
    }
    TType::TType(&elementType,&arrayType,0,false);
    iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
    if (*(long *)(CONCAT44(extraout_var_15,iVar7) + 0x10) !=
        *(long *)(CONCAT44(extraout_var_15,iVar7) + 8)) {
      uVar16 = 0;
      do {
        iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
        pTVar14 = (TIntermTyped *)
                  (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_16,iVar7) + 8) +
                                          uVar16 * 8) + 0x18))();
        pTVar14 = convertInitializerList(this,loc,&elementType,pTVar14);
        iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
        *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_17,iVar7) + 8) + uVar16 * 8) = pTVar14;
        iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
        if (*(long *)(*(long *)(CONCAT44(extraout_var_18,iVar7) + 8) + uVar16 * 8) == 0) {
          return (TIntermTyped *)0x0;
        }
        uVar16 = uVar16 + 1;
        iVar7 = (*node->_vptr_TIntermNode[0x32])(node);
      } while (uVar16 < (ulong)(*(long *)(CONCAT44(extraout_var_19,iVar7) + 0x10) -
                                *(long *)(CONCAT44(extraout_var_19,iVar7) + 8) >> 3));
    }
    type = &arrayType;
LAB_004c00a6:
    pTVar14 = addConstructor(this,loc,node,type);
  }
  return pTVar14;
}

Assistant:

TIntermTyped* TParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type, TIntermTyped* initializer)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (! initList || initList->getOp() != EOpNull)
        return initializer;

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes());  // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        arrayType.changeOuterArraySize((int)initList->getSequence().size());
        TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
        if (arrayType.isArrayOfArrays() && firstInit->getType().isArray() &&
            arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
            for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                    arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
            }
        }

        TType elementType(arrayType, 0); // dereferenced type
        for (size_t i = 0; i < initList->getSequence().size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.getMatrixCols() != (int)initList->getSequence().size()) {
            error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TType vectorType(type, 0); // dereferenced type
        for (int i = 0; i < type.getMatrixCols(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, vectorType, initList->getSequence()[i]->getAsTyped());
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isVector()) {
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
            return nullptr;
        }
        TBasicType destType = type.getBasicType();
        for (int i = 0; i < type.getVectorSize(); ++i) {
            TBasicType initType = initList->getSequence()[i]->getAsTyped()->getBasicType();
            if (destType != initType && !intermediate.canImplicitlyPromote(initType, destType)) {
                error(loc, "type mismatch in initializer list", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
                return nullptr;
            }

        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermNode* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0];
    else
        emulatedConstructorArguments = initList;
    return addConstructor(loc, emulatedConstructorArguments, type);
}